

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_parse.c
# Opt level: O3

ngx_int_t ngx_http_parse_set_cookie_lines(ngx_array_t *headers,ngx_str_t *name,ngx_str_t *value)

{
  u_char *puVar1;
  u_char uVar2;
  void *pvVar3;
  ngx_log_t *log;
  long lVar4;
  ulong uVar5;
  u_char *puVar6;
  ngx_int_t nVar7;
  u_char *puVar8;
  u_char *puVar9;
  u_char *puVar10;
  u_char *puVar11;
  ulong uVar12;
  
  if (headers->nelts != 0) {
    pvVar3 = headers->elts;
    uVar12 = 0;
    do {
      log = headers->pool->log;
      if ((log->log_level & 0x100) != 0) {
        lVar4 = *(long *)((long)pvVar3 + uVar12 * 8);
        ngx_log_error_core(8,log,0,"parse header: \"%V: %V\"",lVar4 + 8,lVar4 + 0x18);
      }
      lVar4 = *(long *)((long)pvVar3 + uVar12 * 8);
      uVar5 = *(ulong *)(lVar4 + 0x18);
      if (name->len < uVar5) {
        puVar8 = *(u_char **)(lVar4 + 0x20);
        nVar7 = ngx_strncasecmp(puVar8,name->data,name->len);
        if (nVar7 == 0) {
          puVar1 = puVar8 + uVar5;
          puVar8 = puVar8 + name->len;
          if ((long)name->len < (long)uVar5) {
            do {
              if (*puVar8 != ' ') break;
              puVar8 = puVar8 + 1;
            } while (puVar8 < puVar1);
          }
          if ((puVar8 != puVar1) && (*puVar8 == '=')) {
            puVar6 = puVar8 + 1;
            puVar8 = puVar8 + 1;
            goto LAB_00145c20;
          }
        }
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 < headers->nelts);
  }
  return -5;
  while( true ) {
    uVar2 = *puVar10;
    puVar6 = puVar9 + 1;
    puVar8 = puVar10 + 1;
    if (uVar2 != ' ') break;
LAB_00145c20:
    puVar10 = puVar8;
    puVar9 = puVar6;
    puVar11 = puVar10;
    if (puVar1 <= puVar10) goto LAB_00145c5c;
  }
  for (; (uVar2 != ';' && (puVar11 = puVar8, puVar8 < puVar1)); puVar8 = puVar8 + 1) {
    uVar2 = *puVar8;
  }
LAB_00145c5c:
  value->len = (long)puVar11 - (long)puVar9;
  value->data = puVar10;
  return uVar12;
}

Assistant:

ngx_int_t
ngx_http_parse_set_cookie_lines(ngx_array_t *headers, ngx_str_t *name,
    ngx_str_t *value)
{
    ngx_uint_t         i;
    u_char            *start, *last, *end;
    ngx_table_elt_t  **h;

    h = headers->elts;

    for (i = 0; i < headers->nelts; i++) {

        ngx_log_debug2(NGX_LOG_DEBUG_HTTP, headers->pool->log, 0,
                       "parse header: \"%V: %V\"", &h[i]->key, &h[i]->value);

        if (name->len >= h[i]->value.len) {
            continue;
        }

        start = h[i]->value.data;
        end = h[i]->value.data + h[i]->value.len;

        if (ngx_strncasecmp(start, name->data, name->len) != 0) {
            continue;
        }

        for (start += name->len; start < end && *start == ' '; start++) {
            /* void */
        }

        if (start == end || *start++ != '=') {
            /* the invalid header value */
            continue;
        }

        while (start < end && *start == ' ') { start++; }

        for (last = start; last < end && *last != ';'; last++) {
            /* void */
        }

        value->len = last - start;
        value->data = start;

        return i;
    }

    return NGX_DECLINED;
}